

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O3

ExecutionResult * __thiscall
cmm::CMMInterpreter::executeStatement
          (ExecutionResult *__return_storage_ptr__,CMMInterpreter *this,VariableEnv *Env,
          StatementAST *Stmt)

{
  StatementKind SVar1;
  StatementKind __val;
  uint uVar2;
  long *plVar3;
  undefined8 extraout_RAX;
  uint uVar4;
  BlockAST *pBVar5;
  ulong uVar6;
  uint __len;
  CMMInterpreter *pCVar7;
  string __str;
  undefined1 local_68 [16];
  undefined1 local_58 [48];
  
  pCVar7 = (CMMInterpreter *)local_68;
  if (Stmt == (StatementAST *)0x0) {
    __return_storage_ptr__->Kind = NormalStatementResult;
    goto LAB_0010b6a8;
  }
  SVar1 = Stmt->Kind;
  switch(SVar1) {
  case ExprStatement:
    executeExprStatement(__return_storage_ptr__,this,Env,(ExprStatementAST *)Stmt);
    break;
  case BlockStatement:
    executeBlock(__return_storage_ptr__,this,Env,(BlockAST *)Stmt);
    break;
  case IfStatement:
    executeIfStatement(__return_storage_ptr__,this,Env,(IfStatementAST *)Stmt);
    break;
  case WhileStatement:
    executeWhileStatement(__return_storage_ptr__,this,Env,(WhileStatementAST *)Stmt);
    break;
  case ForStatement:
    executeForStatement(__return_storage_ptr__,this,Env,(ForStatementAST *)Stmt);
    break;
  case ReturnStatement:
    executeReturnStatement(__return_storage_ptr__,this,Env,(ReturnStatementAST *)Stmt);
    break;
  case ContinueStatement:
    __return_storage_ptr__->Kind = ContinueStatementResult;
    goto LAB_0010b6a8;
  case BreakStatement:
    __return_storage_ptr__->Kind = BreakStatementResult;
LAB_0010b6a8:
    (__return_storage_ptr__->ReturnValue).Type = VoidType;
    (__return_storage_ptr__->ReturnValue).StrVal._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->ReturnValue).StrVal.field_2;
    (__return_storage_ptr__->ReturnValue).StrVal._M_string_length = 0;
    (__return_storage_ptr__->ReturnValue).StrVal.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->ReturnValue).ArrayPtr.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ReturnValue).ArrayPtr.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    break;
  case DeclarationStatement:
    local_68._0_8_ = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"single declaration should not be used by user","");
    RuntimeError(pCVar7,(string *)local_68);
  default:
    __val = -SVar1;
    if (0 < (int)SVar1) {
      __val = SVar1;
    }
    __len = 1;
    if (DeclarationListStatement < __val) {
      uVar6 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar4 = (uint)uVar6;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_0010b7a4;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_0010b7a4;
        }
        if (uVar4 < 10000) goto LAB_0010b7a4;
        uVar6 = uVar6 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar4);
      __len = __len + 1;
    }
LAB_0010b7a4:
    pCVar7 = (CMMInterpreter *)(local_58 + 0x10);
    local_58._16_8_ = (BlockAST *)(local_58 + 0x20);
    std::__cxx11::string::_M_construct((ulong)pCVar7,(char)__len - (char)((int)SVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((StatementAST *)local_58._16_8_)->super_AST)._vptr_AST +
                       (ulong)(SVar1 >> 0x1f)),__len,__val);
    plVar3 = (long *)std::__cxx11::string::append((char *)pCVar7);
    local_68._0_8_ = *plVar3;
    pBVar5 = (BlockAST *)(plVar3 + 2);
    if ((BlockAST *)local_68._0_8_ == pBVar5) {
      local_58._0_8_ = (pBVar5->super_StatementAST).super_AST._vptr_AST;
      local_58._8_8_ = plVar3[3];
      local_68._0_8_ = (BlockAST *)local_58;
    }
    else {
      local_58._0_8_ = (pBVar5->super_StatementAST).super_AST._vptr_AST;
    }
    local_68._8_8_ = plVar3[1];
    *plVar3 = (long)pBVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    RuntimeError(pCVar7,(string *)local_68);
    if ((BlockAST *)local_68._0_8_ != (BlockAST *)local_58) {
      operator_delete((void *)local_68._0_8_);
    }
    if ((BlockAST *)local_58._16_8_ != (BlockAST *)(local_58 + 0x20)) {
      operator_delete((void *)local_58._16_8_);
    }
    _Unwind_Resume(extraout_RAX);
  case DeclarationListStatement:
    executeDeclarationList(__return_storage_ptr__,this,Env,(DeclarationListAST *)Stmt);
  }
  return __return_storage_ptr__;
}

Assistant:

CMMInterpreter::ExecutionResult
CMMInterpreter::executeStatement(VariableEnv *Env, const StatementAST *Stmt) {
  if (!Stmt)
    return ExecutionResult();

  switch (Stmt->getKind()) {
  default:
    RuntimeError(std::to_string(Stmt->getKind()) + ": unknown statement kind");
  case StatementAST::DeclarationStatement:
    RuntimeError("single declaration should not be used by user");
  case StatementAST::DeclarationListStatement:
    return executeDeclarationList(Env, Stmt->as_cptr<DeclarationListAST>());
  case StatementAST::ExprStatement:
    return executeExprStatement(Env, Stmt->as_cptr<ExprStatementAST>());
  case StatementAST::BlockStatement:
    return executeBlock(Env, Stmt->as_cptr<BlockAST>());
  case StatementAST::IfStatement:
    return executeIfStatement(Env, Stmt->as_cptr<IfStatementAST>());
  case StatementAST::ReturnStatement:
    return executeReturnStatement(Env, Stmt->as_cptr<ReturnStatementAST>());
  case StatementAST::WhileStatement:
    return executeWhileStatement(Env, Stmt->as_cptr<WhileStatementAST>());
  case StatementAST::ForStatement:
    return executeForStatement(Env, Stmt->as_cptr<ForStatementAST>());
  case StatementAST::ContinueStatement:
    return executeContinueStatement(Env, Stmt->as_cptr<ContinueStatementAST>());
  case StatementAST::BreakStatement:
    return executeBreakStatement(Env, Stmt->as_cptr<BreakStatementAST>());
  }
}